

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O3

void __thiscall
SBarInfoCommandFlowControl::Tick
          (SBarInfoCommandFlowControl *this,SBarInfoMainBlock *block,DSBarInfo *statusBar,
          bool hudChanged)

{
  SBarInfoCommand **ppSVar1;
  long *plVar2;
  long lVar3;
  ulong uVar4;
  
  uVar4 = (ulong)this->commands[this->truth].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.
                 Count;
  if (uVar4 != 0) {
    ppSVar1 = this->commands[this->truth].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array;
    lVar3 = 0;
    do {
      plVar2 = *(long **)((long)ppSVar1 + lVar3);
      (**(code **)(*plVar2 + 0x28))(plVar2,block,statusBar,hudChanged);
      lVar3 = lVar3 + 8;
    } while (uVar4 << 3 != lVar3);
  }
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			for(auto command : commands[truth])
				command->Tick(block, statusBar, hudChanged);
		}